

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_cfg.cpp
# Opt level: O0

bool __thiscall mocker::RewriteBranches::operator()(RewriteBranches *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  FunctionModule *this_00;
  bool bVar1;
  BasicBlockList *this_01;
  reference this_02;
  InstList *this_03;
  element_type *peVar2;
  shared_ptr<mocker::ir::Addr> *v;
  element_type *peVar3;
  int64_t iVar4;
  element_type *this_04;
  size_t sVar5;
  BasicBlock *bb_00;
  shared_ptr<mocker::ir::Label> *local_110;
  shared_ptr<mocker::ir::Label> *local_e0;
  undefined1 local_b8 [8];
  shared_ptr<mocker::ir::Label> notTarget;
  undefined1 local_98 [8];
  shared_ptr<mocker::ir::Label> target;
  undefined1 local_78 [8];
  shared_ptr<mocker::ir::IntLiteral> condition;
  undefined1 local_60 [8];
  shared_ptr<mocker::ir::Branch> br;
  shared_ptr<mocker::ir::IRInst> *inst;
  iterator __end2;
  iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  BasicBlockList *__range1;
  RewriteBranches *this_local;
  
  this_01 = ir::FunctionModule::getMutableBBs_abi_cxx11_((this->super_FuncPass).func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_01);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_01);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&bb), bVar1) {
    this_02 = std::_List_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    this_03 = ir::BasicBlock::getMutableInsts_abi_cxx11_(this_02);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_03);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_03);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
      br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)local_60,
                 (shared_ptr<mocker::ir::IRInst> *)
                 br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        v = ir::Branch::getCondition(peVar2);
        ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>((ir *)local_78,v);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
        if (bVar1) {
          this->cnt = this->cnt + 1;
          peVar3 = std::
                   __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_78);
          iVar4 = ir::IntLiteral::getVal(peVar3);
          if (iVar4 == 0) {
            peVar2 = std::
                     __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_60);
            local_e0 = ir::Branch::getElse(peVar2);
          }
          else {
            peVar2 = std::
                     __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_60);
            local_e0 = ir::Branch::getThen(peVar2);
          }
          std::shared_ptr<mocker::ir::Label>::shared_ptr
                    ((shared_ptr<mocker::ir::Label> *)local_98,local_e0);
          std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
                    ((shared_ptr<mocker::ir::Label> *)
                     &notTarget.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          __r = &notTarget.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
          std::shared_ptr<mocker::ir::IRInst>::operator=
                    ((shared_ptr<mocker::ir::IRInst> *)
                     br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,(shared_ptr<mocker::ir::Jump> *)__r);
          std::shared_ptr<mocker::ir::Jump>::~shared_ptr((shared_ptr<mocker::ir::Jump> *)__r);
          peVar3 = std::
                   __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_78);
          iVar4 = ir::IntLiteral::getVal(peVar3);
          if (iVar4 == 0) {
            peVar2 = std::
                     __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_60);
            local_110 = ir::Branch::getThen(peVar2);
          }
          else {
            peVar2 = std::
                     __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_60);
            local_110 = ir::Branch::getElse(peVar2);
          }
          std::shared_ptr<mocker::ir::Label>::shared_ptr
                    ((shared_ptr<mocker::ir::Label> *)local_b8,local_110);
          this_00 = (this->super_FuncPass).func;
          this_04 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_b8);
          sVar5 = ir::Label::getID(this_04);
          bb_00 = ir::FunctionModule::getMutableBasicBlock(this_00,sVar5);
          sVar5 = ir::BasicBlock::getLabelID(this_02);
          deletePhiOptionInBB(bb_00,sVar5);
          std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_b8)
          ;
          std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_98)
          ;
          condition.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 0;
        }
        else {
          condition.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 5;
        }
        std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
                  ((shared_ptr<mocker::ir::IntLiteral> *)local_78);
      }
      else {
        condition.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ = 5;
      }
      std::shared_ptr<mocker::ir::Branch>::~shared_ptr((shared_ptr<mocker::ir::Branch> *)local_60);
      std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  }
  return this->cnt != 0;
}

Assistant:

bool RewriteBranches::operator()() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto br = ir::dyc<ir::Branch>(inst);
      if (!br)
        continue;
      auto condition = ir::dyc<ir::IntLiteral>(br->getCondition());
      if (!condition)
        continue;
      ++cnt;
      auto target = condition->getVal() ? br->getThen() : br->getElse();
      inst = std::make_shared<ir::Jump>(target);
      auto notTarget = condition->getVal() ? br->getElse() : br->getThen();
      deletePhiOptionInBB(func.getMutableBasicBlock(notTarget->getID()),
                          bb.getLabelID());
    }
  }

  return cnt != 0;
}